

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_s.cpp
# Opt level: O3

void saxpy(int n,float a,float *x,int incx,float *y,int incy)

{
  uint uVar1;
  ulong uVar2;
  float *pfVar3;
  float *pfVar4;
  ulong uVar5;
  
  if ((0 < n) && ((a != 0.0 || (NAN(a))))) {
    if (incy != 1 || incx != 1) {
      pfVar4 = x + (incx >> 0x1f & (1 - n) * incx);
      pfVar3 = y + (incy >> 0x1f & (1 - n) * incy);
      do {
        *pfVar3 = *pfVar4 * a + *pfVar3;
        pfVar4 = pfVar4 + incx;
        pfVar3 = pfVar3 + incy;
        n = n + -1;
      } while (n != 0);
      return;
    }
    uVar1 = n & 3;
    uVar2 = (ulong)uVar1;
    if (uVar1 != 0) {
      uVar5 = 0;
      do {
        y[uVar5] = x[uVar5] * a + y[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    if (3 < n) {
      do {
        y[uVar2] = x[uVar2] * a + y[uVar2];
        y[uVar2 + 1] = x[uVar2 + 1] * a + y[uVar2 + 1];
        y[uVar2 + 2] = x[uVar2 + 2] * a + y[uVar2 + 2];
        y[uVar2 + 3] = x[uVar2 + 3] * a + y[uVar2 + 3];
        uVar2 = uVar2 + 4;
      } while (uVar2 < (uint)n);
    }
  }
  return;
}

Assistant:

void saxpy ( int n, float a, float x[], int incx, float y[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    SAXPY computes float constant times a vector plus a vector.
//
//  Discussion:
//
//    This routine uses unrolled loops for increments equal to one.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 February 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of elements in X and Y.
//
//    Input, float A, the multiplier of X.
//
//    Input, float X[*], the first vector.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Input/output, float Y[*], the second vector.
//    On output, Y[*] has been replaced by Y[*] + A * X[*].
//
//    Input, int INCY, the increment between successive entries of Y.
//
{
  int i;
  int ix;
  int iy;
  int m;

  if ( n <= 0 )
  {
    return;
  }

  if ( a == 0.0 )
  {
    return;
  }
//
//  Code for unequal increments or equal increments
//  not equal to 1.
//
  if ( incx != 1 || incy != 1 )
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( - n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      y[iy] = y[iy] + a * x[ix];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
//
//  Code for both increments equal to 1.
//
  else
  {
    m = n % 4;

    for ( i = 0; i < m; i++ )
    {
      y[i] = y[i] + a * x[i];
    }

    for ( i = m; i < n; i = i + 4 )
    {
      y[i  ] = y[i  ] + a * x[i  ];
      y[i+1] = y[i+1] + a * x[i+1];
      y[i+2] = y[i+2] + a * x[i+2];
      y[i+3] = y[i+3] + a * x[i+3];
    }
  }

  return;
}